

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangecontrols.cpp
# Opt level: O0

void __thiscall
QAccessibleAbstractSlider::QAccessibleAbstractSlider
          (QAccessibleAbstractSlider *this,QWidget *w,Role r)

{
  undefined4 in_EDX;
  QAccessibleWidget *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QString *name;
  undefined4 in_stack_ffffffffffffffc8;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  name = &local_20;
  QString::QString((QString *)0x7ecd6e);
  QAccessibleWidget::QAccessibleWidget
            (in_RSI,(QWidget *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8),
             (Role)((ulong)in_RDI >> 0x20),name);
  QString::~QString((QString *)0x7ecd8f);
  QAccessibleValueInterface::QAccessibleValueInterface((QAccessibleValueInterface *)(in_RDI + 4));
  *in_RDI = &PTR__QAccessibleAbstractSlider_00d29df0;
  in_RDI[2] = &PTR__QAccessibleAbstractSlider_00d29ee8;
  in_RDI[4] = &PTR__QAccessibleAbstractSlider_00d29f30;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleAbstractSlider::QAccessibleAbstractSlider(QWidget *w, QAccessible::Role r)
    : QAccessibleWidget(w, r)
{
    Q_ASSERT(qobject_cast<QAbstractSlider *>(w));
}